

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_punpckhhw_mips64(uint64_t fs,uint64_t ft)

{
  return fs >> 0x20 & 0xffff | fs >> 0x10 & 0xffff00000000 | ft & 0xffff000000000000 |
         (ulong)((uint)(ft >> 0x10) & 0xffff0000);
}

Assistant:

uint64_t helper_punpckhhw(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.uh[0 ^ host] = vs.uh[2 ^ host];
    vd.uh[1 ^ host] = vt.uh[2 ^ host];
    vd.uh[2 ^ host] = vs.uh[3 ^ host];
    vd.uh[3 ^ host] = vt.uh[3 ^ host];

    return vd.d;
}